

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O3

void amrex::writeIntData<int,long>(long *data,size_t size,ostream *os,IntDescriptor *id)

{
  Ordering OVar1;
  Ordering OVar2;
  int32_t iVar3;
  undefined8 in_RAX;
  IntDescriptor *this;
  size_t sVar4;
  int value;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  OVar1 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar2 = IntDescriptor::order(this);
  if (size != 0) {
    sVar4 = 0;
    do {
      uStack_38 = CONCAT44((int32_t)data[sVar4],(undefined4)uStack_38);
      if (OVar1 != OVar2) {
        iVar3 = swapBytes((int32_t)data[sVar4]);
        uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38);
      }
      std::ostream::write((char *)os,(long)&uStack_38 + 4);
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  return;
}

Assistant:

void writeIntData (const From* data, std::size_t size, std::ostream& os,
                       const amrex::IntDescriptor& id)
    {
        To value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            value = static_cast<To>(data[j]);
            if (swapEndian) value = swapBytes(value);
            os.write((char*) &value, sizeof(To));
        }
    }